

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  int iVar1;
  int i;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  byte *pLim;
  byte *pStr;
  
  if ((p->vStack).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x322,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if ((p->vObjs).nSize != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x324,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  p_00 = &p->vStack;
  p_01 = &p->vObjs;
  Vec_IntPush(p_00,0);
  Vec_WecPushLevel(p_01);
  pStr = (byte *)p->pBuffer;
LAB_002bc4be:
  p->pCur = (char *)pStr;
  if (p->pLimit <= pStr) {
    if ((p->vStack).nSize != 1) {
      __assert_fail("Vec_IntSize(&p->vStack) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                    ,0x34c,"void Smt_PrsReadLines(Smt_Prs_t *)");
    }
    if ((p->vObjs).nSize != (p->vObjs).nCap) {
      __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                    ,0x34d,"void Smt_PrsReadLines(Smt_Prs_t *)");
    }
    return;
  }
  while (uVar3 = (ulong)*pStr, pLim = pStr, uVar3 < 0x2a) {
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x28) {
        iVar1 = Vec_IntEntryLast(p_00);
        pVVar2 = Vec_WecEntry(p_01,iVar1);
        iVar1 = Abc_Var2Lit((p->vObjs).nSize,0);
        Vec_IntPush(pVVar2,iVar1);
        Vec_IntPush(p_00,(p->vObjs).nSize);
        Vec_WecPushLevel(p_01);
        goto LAB_002bc5bd;
      }
      if (uVar3 == 0x29) {
        iVar1 = (p->vStack).nSize;
        if (iVar1 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x396,"int Vec_IntPop(Vec_Int_t *)");
        }
        (p->vStack).nSize = iVar1 + -1;
        goto LAB_002bc5bd;
      }
      break;
    }
    pStr = pStr + 1;
    p->pCur = (char *)pStr;
  }
  do {
    if (p->pLimit <= pLim) break;
    if (((ulong)*pLim < 0x2a) && ((0x30100002600U >> ((ulong)*pLim & 0x3f) & 1) != 0)) {
      p->pCur = (char *)(pLim + -1);
      iVar1 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pStr,(char *)pLim,(int *)0x0);
      i = Vec_IntEntryLast(p_00);
      pVVar2 = Vec_WecEntry(p_01,i);
      iVar1 = Abc_Var2Lit(iVar1,1);
      Vec_IntPush(pVVar2,iVar1);
      break;
    }
    p->pCur = (char *)(pLim + 1);
    pLim = pLim + 1;
  } while( true );
LAB_002bc5bd:
  pStr = (byte *)(p->pCur + 1);
  goto LAB_002bc4be;
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // add fanin
                int iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
}